

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

Image * Image_Function_Helper::Normalize
                  (Image *__return_storage_ptr__,NormalizeForm4 normalize,Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x01','\x01');
  (*normalize)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
               __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image Normalize( FunctionTable::NormalizeForm4 normalize,
                     const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        normalize( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }